

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_malloc.cpp
# Opt level: O0

void Omega_h::host_free(void *ptr,size_t param_2)

{
  char *file;
  __cxx11 local_b8 [55];
  allocator local_81;
  string local_80 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [39];
  ScopedTimer local_19;
  size_t sStack_18;
  ScopedTimer omega_h_scoped_function_timer;
  size_t param_1_local;
  void *ptr_local;
  
  sStack_18 = param_2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_80,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_malloc.cpp"
             ,&local_81);
  std::operator+(local_60,(char *)local_80);
  std::__cxx11::to_string(local_b8,0x32);
  std::operator+(local_40,local_60);
  file = (char *)std::__cxx11::string::c_str();
  ScopedTimer::ScopedTimer(&local_19,"host_free",file);
  std::__cxx11::string::~string((string *)local_40);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  free(ptr);
  ScopedTimer::~ScopedTimer(&local_19);
  return;
}

Assistant:

void host_free(void* ptr, std::size_t) {
  OMEGA_H_TIME_FUNCTION;
#ifdef OMEGA_H_USE_CUDA
  auto const err = cudaFreeHost(ptr);
  OMEGA_H_CHECK(err == cudaSuccess);
#else
  ::std::free(ptr);
#endif
}